

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_int>
          (TryCast *this,string_t input,uint32_t *result,bool strict)

{
  byte bVar1;
  bool bVar2;
  idx_t pos;
  long lVar3;
  ulong uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 *puVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  idx_t iVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  IntegerCastData<short> local_7e;
  undefined4 local_7c;
  undefined4 *local_78;
  ulong local_70;
  IntegerDecimalCastData<unsigned_int> local_68;
  ulong local_48;
  string_t input_local;
  
  puVar7 = input.value._8_8_;
  pcVar11 = input.value._0_8_;
  uVar5 = SUB84(result,0);
  pcVar16 = pcVar11;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar16 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = pcVar11;
  uVar17 = (ulong)this & 0xffffffff;
  local_7c._0_1_ = (byte)result;
  if (uVar17 != 0) {
    iVar10 = 3;
    uVar14 = 0;
    do {
      bVar1 = pcVar16[uVar14];
      uVar9 = (uint)bVar1;
      if ((4 < uVar9 - 9) && (uVar9 != 0x20)) {
        if (uVar9 == 0x2d) {
          uVar20 = uVar17 - uVar14;
          uVar15 = 1;
          goto LAB_001d9692;
        }
        if (bVar1 == 0x30 && uVar17 - 1 != uVar14) {
          cVar8 = pcVar16[uVar14 + 1];
          if (cVar8 != 'B') {
            if (cVar8 != 'x') {
              if (cVar8 == 'b') goto LAB_001d9a8e;
              if (cVar8 != 'X') {
                pcVar11 = (char *)0x0;
                bVar21 = false;
                if (((byte)local_7c & (byte)(cVar8 - 0x30U) < 10) == 0) goto LAB_001d9c41;
                goto LAB_001d96b2;
              }
            }
            pcVar11 = (char *)0x0;
            uVar15 = 1;
            goto LAB_001d9752;
          }
LAB_001d9a8e:
          uVar15 = ~uVar14 + uVar17;
          pcVar11 = (char *)0x0;
          bVar21 = uVar15 >= 2;
          if (uVar15 < 2) goto LAB_001d96b2;
          uVar20 = 1;
          pcVar11 = (char *)0x0;
          goto LAB_001d9aaa;
        }
LAB_001d9c41:
        pcVar11 = (char *)0x0;
        bVar21 = false;
        if (((byte)local_7c & bVar1 == 0x2b) != 0) goto LAB_001d96b2;
        local_70 = uVar17 - uVar14;
        local_48 = (ulong)(bVar1 == 0x2b);
        pcVar11 = (char *)0x0;
        uVar15 = local_48;
        goto LAB_001d9c75;
      }
      uVar14 = uVar14 + 1;
    } while (uVar17 != uVar14);
  }
  bVar21 = false;
  goto LAB_001d96b2;
  while (lVar3 = uVar14 + uVar15, uVar15 = uVar15 + 1, pcVar16[lVar3] == '0') {
LAB_001d9692:
    if (uVar20 <= uVar15) {
      uVar15 = 1;
      pcVar11 = (char *)0x0;
      bVar21 = false;
      goto LAB_001d98a3;
    }
  }
  pcVar11 = (char *)0x0;
LAB_001d96aa:
  bVar21 = false;
  goto LAB_001d96b2;
  while( true ) {
    bVar2 = true;
    uVar18 = uVar15 + 1;
    if ((~uVar15 + uVar17 != uVar14) && (pcVar16[uVar14 + 1 + uVar15] == '_' && (byte)local_7c == 0)
       ) {
      uVar18 = uVar15 + 2;
      if ((uVar17 - uVar15) - 2 == uVar14) {
        bVar2 = false;
      }
      else {
        bVar2 = (byte)(pcVar16[uVar14 + uVar18] - 0x30U) < 10;
      }
    }
    uVar15 = uVar18;
    pcVar11 = (char *)(ulong)((int)pcVar11 * 10 - (uint)bVar1);
    if (!bVar2) break;
LAB_001d98a3:
    if (uVar20 <= uVar15) goto LAB_001d9d1f;
    bVar1 = pcVar16[uVar14 + uVar15] - 0x30;
    if (9 < bVar1) {
      if (pcVar16[uVar14 + uVar15] == '.') {
        if ((byte)local_7c != 0) goto LAB_001d96aa;
        uVar18 = uVar15 + 1;
        if (uVar18 < uVar20) {
          iVar10 = 0;
          if (9 < (byte)(pcVar16[uVar14 + 1 + uVar15] - 0x30U)) goto LAB_001da24e;
          iVar6 = 1;
        }
        else {
          iVar10 = 3;
LAB_001da24e:
          iVar6 = 1;
          if (1 < uVar15) {
            iVar6 = iVar10;
          }
        }
        uVar15 = uVar18;
        if (iVar6 == 3) goto LAB_001d9d1f;
        if (iVar6 != 0) goto LAB_001d96aa;
      }
      bVar21 = false;
      if (((ulong)(byte)pcVar16[uVar14 + uVar15] < 0x21) &&
         (bVar21 = false, (0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar15] & 0x3f) & 1) != 0)
         ) {
        uVar18 = uVar15 + 1;
        uVar15 = uVar18;
        if (uVar20 <= uVar18) goto LAB_001d9d1f;
        goto LAB_001d9da5;
      }
      break;
    }
  }
  goto LAB_001d96b2;
  while (uVar18 = uVar18 + 1, uVar15 = uVar20, uVar20 != uVar18) {
LAB_001d9da5:
    if ((0x20 < (ulong)(byte)pcVar16[uVar14 + uVar18]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar18] & 0x3f) & 1) == 0))
    goto LAB_001d96aa;
  }
LAB_001d9d1f:
  bVar21 = 1 < uVar15;
  goto LAB_001d96b2;
LAB_001d9752:
  do {
    if (~uVar14 + uVar17 <= uVar15) goto LAB_001d9d1f;
    bVar1 = pcVar16[uVar14 + 1 + uVar15];
    bVar13 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar13 = bVar1;
    }
    if (9 < (byte)(bVar13 - 0x30)) {
      bVar21 = false;
      if ((0x25 < bVar13 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar8 = -0x57;
    if ((char)bVar13 < 'a') {
      cVar8 = -0x30;
    }
    uVar20 = uVar15 + 1;
    if (((uVar17 - uVar15) - 2 == uVar14) || (pcVar16[uVar14 + 2 + uVar15] != '_')) {
LAB_001d9824:
      bVar2 = (uint)pcVar11 <= ~(uint)(byte)(cVar8 + bVar13) >> 4;
      if (bVar2) {
        pcVar11 = (char *)(ulong)((uint)pcVar11 * 0x10 + (uint)(byte)(cVar8 + bVar13));
      }
    }
    else {
      uVar20 = uVar15 + 2;
      if ((uVar17 - uVar15) - 3 != uVar14) {
        if (9 < (byte)(pcVar16[uVar14 + 3 + uVar15] - 0x30U)) {
          bVar2 = false;
          uVar9 = (byte)pcVar16[uVar14 + 3 + uVar15] - 0x41;
          if ((0x25 < uVar9) || ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001d9844;
        }
        goto LAB_001d9824;
      }
      bVar2 = false;
    }
LAB_001d9844:
    bVar21 = false;
    uVar15 = uVar20;
  } while (bVar2);
  goto LAB_001d96b2;
  while( true ) {
    uVar18 = uVar20 + 1;
    if (((uVar17 - uVar20) - 2 != uVar14) && (pcVar16[uVar14 + 2 + uVar20] == '_')) {
      if (((uVar17 - uVar20) - 3 == uVar14) || ((pcVar16[uVar14 + 3 + uVar20] & 0xfeU) != 0x30))
      goto LAB_001d96aa;
      uVar18 = uVar20 + 2;
    }
    uVar20 = uVar18;
    if ((int)pcVar11 < 0) goto LAB_001d96aa;
    pcVar11 = (char *)(ulong)(uint)(iVar10 + (int)pcVar11 * 2);
    bVar21 = true;
    if (uVar15 <= uVar20) break;
LAB_001d9aaa:
    iVar10 = 0;
    if (pcVar16[uVar14 + 1 + uVar20] != '0') {
      if (pcVar16[uVar14 + 1 + uVar20] != '1') goto LAB_001d96aa;
      iVar10 = 1;
    }
  }
  goto LAB_001d96b2;
  while( true ) {
    uVar20 = uVar15 + 1;
    bVar2 = false;
    if ((uint)pcVar11 <= ~(uint)bVar1 / 10) {
      pcVar11 = (char *)(ulong)((uint)pcVar11 * 10 + (uint)bVar1);
      bVar2 = true;
      if ((~uVar15 + uVar17 != uVar14) &&
         (pcVar16[uVar14 + 1 + uVar15] == '_' && (byte)local_7c == 0)) {
        uVar20 = uVar15 + 2;
        if ((uVar17 - uVar15) - 2 == uVar14) {
          bVar2 = false;
        }
        else {
          bVar2 = (byte)(pcVar16[uVar14 + uVar20] - 0x30U) < 10;
        }
      }
    }
    bVar21 = false;
    uVar15 = uVar20;
    if (!bVar2) break;
LAB_001d9c75:
    if (local_70 <= uVar15) goto LAB_001d9d2b;
    bVar1 = pcVar16[uVar14 + uVar15] - 0x30;
    if (9 < bVar1) {
      if (pcVar16[uVar14 + uVar15] == '.') {
        if ((byte)local_7c != 0) goto LAB_001d96aa;
        uVar20 = uVar15 + 1;
        if ((uVar20 < local_70) && (iVar10 = 0, (byte)(pcVar16[uVar14 + 1 + uVar15] - 0x30U) < 10))
        {
          iVar6 = 1;
        }
        else {
          iVar6 = 1;
          if (local_48 < uVar15) {
            iVar6 = iVar10;
          }
        }
        uVar15 = uVar20;
        if (iVar6 == 3) goto LAB_001d9d2b;
        if (iVar6 != 0) goto LAB_001d96aa;
      }
      bVar21 = false;
      if (((ulong)(byte)pcVar16[uVar14 + uVar15] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar15] & 0x3f) & 1) != 0)) {
        uVar20 = uVar15 + 1;
        uVar15 = uVar20;
        if (local_70 <= uVar20) goto LAB_001d9d2b;
        goto LAB_001d9fcc;
      }
      break;
    }
  }
  goto LAB_001d96b2;
  while (lVar3 = uVar14 + uVar20, uVar20 = uVar20 + 1, pcVar16[lVar3] == '0') {
LAB_001d9880:
    if (uVar15 <= uVar20) {
      local_68.result = 0;
      uVar20 = 1;
      goto LAB_001d9b8c;
    }
  }
  goto LAB_001d96ea;
  while( true ) {
    bVar1 = pcVar16[uVar14 + uVar20] - 0x30;
    if (9 < bVar1) {
      if (pcVar16[uVar14 + uVar20] != '.') goto LAB_001da1ff;
      if ((byte)local_7c != 0) goto LAB_001d96e8;
      uVar18 = uVar20 + 1;
      if (uVar15 <= uVar18) {
        iVar10 = 3;
        uVar19 = uVar18;
        goto LAB_001da3d9;
      }
      local_68.decimal = 0;
      uVar4 = uVar18;
      goto LAB_001d9f08;
    }
    uVar18 = uVar20 + 1;
    if (local_68.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar21 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar1;
      bVar21 = true;
      if ((~uVar20 + uVar17 != uVar14) &&
         (pcVar16[uVar14 + 1 + uVar20] == '_' && (byte)local_7c == 0)) {
        uVar18 = uVar20 + 2;
        if ((uVar17 - uVar20) - 2 == uVar14) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar16[uVar14 + uVar18] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar18;
    if (!bVar21) break;
LAB_001d9b8c:
    if (uVar15 <= uVar20) goto LAB_001d9ea8;
  }
  goto LAB_001d9f90;
  while (uVar4 = uVar19, uVar19 < uVar15) {
LAB_001d9f08:
    bVar1 = pcVar16[uVar14 + uVar4] - 0x30;
    local_70 = uVar18;
    if (9 < bVar1) {
      iVar10 = 0;
      goto LAB_001da3c9;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar19 = uVar4 + 1;
    if (((~uVar4 + uVar17 != uVar14) && (pcVar16[uVar14 + 1 + uVar4] == '_')) &&
       ((uVar19 = uVar4 + 2, (uVar17 - uVar4) - 2 == uVar14 ||
        (9 < (byte)(pcVar16[uVar14 + uVar19] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar6 = 1;
      goto LAB_001da3ec;
    }
  }
  iVar10 = 3;
LAB_001da3c9:
  local_68._18_6_ = 0;
  uVar19 = uVar4;
LAB_001da3d9:
  iVar6 = 1;
  if (uVar18 < uVar19) {
    iVar6 = iVar10;
  }
  if (1 < uVar20) {
    iVar6 = iVar10;
  }
LAB_001da3ec:
  uVar20 = uVar19;
  if (iVar6 == 3) {
LAB_001d9ea8:
    bVar21 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>(&local_68);
    if (bVar21) {
      bVar21 = 1 < uVar20;
      goto LAB_001d96ea;
    }
  }
  else if (iVar6 == 0) {
LAB_001da1ff:
    bVar1 = pcVar16[uVar14 + uVar20];
    if (bVar1 - 9 < 5) {
LAB_001da213:
      uVar17 = uVar20 + 1;
      uVar20 = uVar17;
      if (uVar17 < uVar15) {
        do {
          if ((0x20 < (ulong)(byte)pcVar16[uVar14 + uVar17]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar17] & 0x3f) & 1) == 0))
          goto LAB_001d9f90;
          uVar17 = uVar17 + 1;
          uVar20 = uVar15;
        } while (uVar15 != uVar17);
      }
      goto LAB_001d9ea8;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar20 != 1 && (byte)local_7c == 0) && (uVar20 + 1 < uVar15)) {
        local_7e.result = 0;
        pcVar16 = pcVar16 + uVar14 + uVar20 + 1;
        iVar12 = ~uVar14 + (uVar17 - uVar20);
        if (*pcVar16 == '-') {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar16,iVar12,&local_7e,false);
        }
        else {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar16,iVar12,&local_7e,false);
        }
        puVar7 = local_78;
        bVar21 = false;
        local_78 = puVar7;
        if (bVar2 != false) {
          bVar21 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                             (&local_68,local_7e.result);
          local_78 = puVar7;
        }
        goto LAB_001d96ea;
      }
    }
    else if (bVar1 == 0x20) goto LAB_001da213;
  }
LAB_001d9f90:
  bVar21 = false;
  goto LAB_001d96ea;
  while( true ) {
    uVar4 = uVar20 + 1;
    if (((uVar17 - uVar20) - 2 != uVar14) && (pcVar16[uVar14 + 2 + uVar20] == '_')) {
      if (((uVar17 - uVar20) - 3 == uVar14) || ((pcVar16[uVar14 + 3 + uVar20] & 0xfeU) != 0x30))
      goto LAB_001d96e8;
      uVar4 = uVar20 + 2;
    }
    uVar20 = uVar4;
    if (0x3fffffffffffffff < local_68.result) goto LAB_001d96e8;
    local_68.result = uVar18 + local_68.result * 2;
    if (uVar15 <= uVar20) break;
LAB_001d9df9:
    if (pcVar16[uVar14 + 1 + uVar20] == '0') {
      uVar18 = 0;
    }
    else {
      uVar18 = 1;
      if (pcVar16[uVar14 + 1 + uVar20] != '1') goto LAB_001d96e8;
    }
  }
LAB_001d9e85:
  bVar21 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                     (&local_68);
  bVar21 = bVar21 && 1 < uVar15;
  goto LAB_001d96ea;
LAB_001d997d:
  do {
    if (~uVar14 + uVar17 <= uVar15) {
      bVar21 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_68);
      bVar21 = 1 < uVar15 && bVar21;
      goto LAB_001d96ea;
    }
    bVar1 = pcVar16[uVar14 + 1 + uVar15];
    bVar13 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar13 = bVar1;
    }
    if ((9 < (byte)(bVar13 - 0x30)) &&
       ((0x25 < bVar13 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar13 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar8 = -0x57;
    if ((char)bVar13 < 'a') {
      cVar8 = -0x30;
    }
    uVar20 = uVar15 + 1;
    if (((uVar17 - uVar15) - 2 == uVar14) || (pcVar16[uVar14 + 2 + uVar15] != '_')) {
LAB_001d9a54:
      uVar15 = (ulong)((byte)(cVar8 + bVar13) >> 4) ^ 0x7ffffffffffffff;
      lVar3 = local_68.result;
      if (local_68.result <= (long)uVar15) {
        lVar3 = local_68.result * 0x10 + (ulong)(byte)(cVar8 + bVar13);
      }
      bVar21 = local_68.result <= (long)uVar15;
      local_68.result = lVar3;
    }
    else {
      uVar20 = uVar15 + 2;
      if ((uVar17 - uVar15) - 3 != uVar14) {
        if (9 < (byte)(pcVar16[uVar14 + 3 + uVar15] - 0x30U)) {
          uVar9 = (byte)pcVar16[uVar14 + 3 + uVar15] - 0x41;
          bVar21 = false;
          if ((0x25 < uVar9) || (bVar21 = false, (0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001d9a7b;
        }
        goto LAB_001d9a54;
      }
      bVar21 = false;
    }
LAB_001d9a7b:
    uVar15 = uVar20;
  } while (bVar21);
  goto LAB_001d96e8;
  while( true ) {
    uVar18 = uVar20 + 1;
    bVar21 = false;
    if (local_68.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar1;
      bVar21 = true;
      if ((~uVar20 + uVar17 != uVar14) &&
         (pcVar16[uVar14 + 1 + uVar20] == '_' && (byte)local_7c == 0)) {
        uVar18 = uVar20 + 2;
        if ((uVar17 - uVar20) - 2 == uVar14) {
          bVar21 = false;
        }
        else {
          bVar21 = (byte)(pcVar16[uVar14 + uVar18] - 0x30U) < 10;
        }
      }
    }
    uVar20 = uVar18;
    if (!bVar21) break;
LAB_001da033:
    if (uVar15 <= uVar20) goto LAB_001da10b;
    bVar1 = pcVar16[uVar14 + uVar20] - 0x30;
    if (9 < bVar1) {
      if (pcVar16[uVar14 + uVar20] != '.') goto LAB_001da29d;
      if ((byte)local_7c == 0) {
        uVar18 = uVar20 + 1;
        if (uVar15 <= uVar18) {
          iVar10 = 3;
          uVar19 = uVar18;
          goto LAB_001da417;
        }
        local_68.decimal = 0;
        uVar4 = uVar18;
        goto LAB_001da16c;
      }
      break;
    }
  }
  goto LAB_001d96e8;
  while (uVar4 = uVar19, uVar19 < uVar15) {
LAB_001da16c:
    bVar1 = pcVar16[uVar14 + uVar4] - 0x30;
    local_48 = uVar18;
    if (9 < bVar1) {
      iVar10 = 0;
      goto LAB_001da407;
    }
    if (local_68.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar1;
    }
    uVar19 = uVar4 + 1;
    if (((~uVar4 + uVar17 != uVar14) && (pcVar16[uVar14 + 1 + uVar4] == '_')) &&
       ((uVar19 = uVar4 + 2, (uVar17 - uVar4) - 2 == uVar14 ||
        (9 < (byte)(pcVar16[uVar14 + uVar19] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar6 = 1;
      goto LAB_001da42b;
    }
  }
  iVar10 = 3;
LAB_001da407:
  local_68._18_6_ = 0;
  uVar19 = uVar4;
LAB_001da417:
  iVar6 = 1;
  if (uVar18 < uVar19) {
    iVar6 = iVar10;
  }
  if (local_70 < uVar20) {
    iVar6 = iVar10;
  }
LAB_001da42b:
  uVar20 = uVar19;
  if (iVar6 == 3) {
LAB_001da10b:
    bVar21 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_68);
    if (bVar21) {
      bVar21 = local_70 < uVar20;
      local_78 = puVar7;
      goto LAB_001d96ea;
    }
  }
  else if (iVar6 == 0) {
LAB_001da29d:
    bVar1 = pcVar16[uVar14 + uVar20];
    if (bVar1 - 9 < 5) {
LAB_001da2ad:
      uVar17 = uVar20 + 1;
      uVar20 = uVar17;
      if (uVar17 < uVar15) {
        do {
          if ((0x20 < (ulong)(byte)pcVar16[uVar14 + uVar17]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar17] & 0x3f) & 1) == 0))
          goto LAB_001d96e8;
          uVar17 = uVar17 + 1;
          uVar20 = uVar15;
        } while (uVar15 != uVar17);
      }
      goto LAB_001da10b;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar20 != local_70 && (byte)local_7c == 0) && (uVar20 + 1 < uVar15)) {
        local_7e.result = 0;
        pcVar16 = pcVar16 + uVar14 + uVar20 + 1;
        iVar12 = ~uVar14 + (uVar17 - uVar20);
        if (*pcVar16 == '-') {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar16,iVar12,&local_7e,false);
        }
        else {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar16,iVar12,&local_7e,false);
        }
        bVar21 = false;
        if (bVar2 != false) {
          bVar21 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                             (&local_68,local_7e.result);
        }
        goto LAB_001d96ea;
      }
    }
    else if (bVar1 == 0x20) goto LAB_001da2ad;
  }
  goto LAB_001d96e8;
  while (uVar20 = uVar20 + 1, uVar15 = local_70, local_70 != uVar20) {
LAB_001d9fcc:
    if ((0x20 < (ulong)(byte)pcVar16[uVar14 + uVar20]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar16[uVar14 + uVar20] & 0x3f) & 1) == 0))
    goto LAB_001d96aa;
  }
LAB_001d9d2b:
  bVar21 = local_48 < uVar15;
LAB_001d96b2:
  if (bVar21) {
    *puVar7 = (int)pcVar11;
    bVar21 = true;
  }
  else {
    local_78 = puVar7;
    if (uVar17 != 0) {
      uVar14 = 0;
      do {
        bVar1 = pcVar16[uVar14];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar15 = uVar17 - uVar14;
          local_68.decimal_digits = 0;
          local_7c = uVar5;
          input_local.value._0_8_ = this;
          if (bVar1 == 0x2d) {
            bVar21 = false;
            uVar20 = 1;
            goto LAB_001d9880;
          }
          if (bVar1 == 0x30 && uVar17 - 1 != uVar14) {
            cVar8 = pcVar16[uVar14 + 1];
            if (cVar8 == 'B') {
LAB_001d9dd1:
              uVar15 = ~uVar14 + uVar17;
              if (uVar15 < 2) goto LAB_001d9e85;
              local_68.result = 0;
              uVar20 = 1;
              goto LAB_001d9df9;
            }
            if (cVar8 != 'x') {
              if (cVar8 == 'b') goto LAB_001d9dd1;
              if (cVar8 != 'X') {
                if (((byte)local_7c & (byte)(cVar8 - 0x30U) < 10) == 0) goto LAB_001da00f;
                break;
              }
            }
            local_68.result = 0;
            uVar15 = 1;
            goto LAB_001d997d;
          }
LAB_001da00f:
          if (((byte)local_7c & bVar1 == 0x2b) == 0) {
            local_70 = (ulong)(bVar1 == 0x2b);
            local_68.result = 0;
            uVar20 = local_70;
            goto LAB_001da033;
          }
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
    }
LAB_001d96e8:
    bVar21 = false;
    local_78 = puVar7;
LAB_001d96ea:
    if (bVar21 != false) {
      *local_78 = (undefined4)local_68.result;
    }
  }
  return bVar21;
}

Assistant:

bool TryCast::Operation(string_t input, uint32_t &result, bool strict) {
	return TrySimpleIntegerCast<uint32_t, false>(input.GetData(), input.GetSize(), result, strict);
}